

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

SparseTextureProperties *
Diligent::GetStandardSparseTextureProperties
          (SparseTextureProperties *__return_storage_ptr__,TextureDesc *TexDesc)

{
  RESOURCE_DIMENSION RVar1;
  uint uVar2;
  byte bVar3;
  Uint32 UVar4;
  uint uVar5;
  TextureFormatAttribs *pTVar6;
  ulong uVar7;
  Uint64 UVar8;
  byte bVar9;
  uint uVar10;
  char (*Args_1) [54];
  char (*Args_1_00) [34];
  ulong uVar11;
  uint uVar12;
  Uint32 MipLevel;
  Uint64 UVar13;
  uint uVar14;
  string msg;
  undefined1 local_88 [40];
  Uint64 local_60;
  Uint64 local_58;
  long local_50;
  int local_44;
  SparseTextureProperties *local_40;
  ulong local_38;
  
  pTVar6 = GetTextureFormatAttribs(TexDesc->Format);
  Args_1 = (char (*) [54])(ulong)pTVar6->NumComponents;
  uVar12 = 1;
  if (pTVar6->ComponentType != COMPONENT_TYPE_COMPRESSED) {
    uVar12 = (uint)pTVar6->NumComponents;
  }
  uVar12 = uVar12 * pTVar6->ComponentSize;
  uVar5 = uVar12 - 1;
  if ((uVar12 ^ uVar5) <= uVar5) {
    FormatString<char[26],char[24]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(TexelSize)",(char (*) [24])Args_1);
    Args_1 = (char (*) [54])0xb34;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb34);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  if (0xf < uVar5) {
    FormatString<char[26],char[34]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexelSize >= 1 && TexelSize <= 16",(char (*) [34])Args_1);
    Args_1 = (char (*) [54])0xb35;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb35);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  if (4 < (byte)(TexDesc->Type - RESOURCE_DIM_TEX_2D)) {
    FormatString<char[26],char[33]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexDesc.Is2D() || TexDesc.Is3D()",(char (*) [33])Args_1);
    Args_1 = (char (*) [54])0xb36;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb36);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  UVar4 = TexDesc->MipLevels;
  if (UVar4 == 0) {
    FormatString<char[46]>
              ((string *)local_88,(char (*) [46])"Number of mipmap calculation is not supported");
    Args_1 = (char (*) [54])0xb37;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb37);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
    UVar4 = TexDesc->MipLevels;
  }
  if ((TexDesc->SampleCount != 1) && (UVar4 != 1)) {
    FormatString<char[44]>
              ((string *)local_88,(char (*) [44])"Multisampled textures must have 1 mip level");
    Args_1 = (char (*) [54])0xb38;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb38);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  __return_storage_ptr__->MipTailStride = 0;
  __return_storage_ptr__->MipTailSize = 0;
  __return_storage_ptr__->AddressSpaceSize = 0;
  __return_storage_ptr__->MipTailOffset = 0;
  __return_storage_ptr__->FirstMipInTail = 0xffffffff;
  __return_storage_ptr__->TileSize[0] = 0;
  __return_storage_ptr__->TileSize[1] = 0;
  *(undefined8 *)(__return_storage_ptr__->TileSize + 2) = 0;
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  if (TexDesc->Type == RESOURCE_DIM_TEX_3D) {
    if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      FormatString<char[58]>
                ((string *)local_88,
                 (char (*) [58])"Compressed sparse 3D textures are currently not supported");
      DebugAssertionFailed
                ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb3e);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
      }
    }
    __return_storage_ptr__->TileSize[0] = 0x40;
    __return_storage_ptr__->TileSize[1] = 0x20;
    __return_storage_ptr__->TileSize[2] = 0x20;
    if (1 < uVar12) {
      uVar5 = 0;
      bVar9 = 1;
      do {
        __return_storage_ptr__->TileSize[*(long *)(&DAT_003673c0 + (ulong)(uVar5 % 3) * 8)] =
             __return_storage_ptr__->TileSize[*(long *)(&DAT_003673c0 + (ulong)(uVar5 % 3) * 8)] >>
             1;
        bVar3 = bVar9 & 0x1f;
        uVar5 = uVar5 + 1;
        bVar9 = bVar9 + 1;
      } while ((uint)(1 << bVar3) < uVar12);
    }
    goto LAB_002fab6c;
  }
  uVar5 = TexDesc->SampleCount;
  if (uVar5 < 2) {
    __return_storage_ptr__->TileSize[0] = 0x100;
    __return_storage_ptr__->TileSize[1] = 0x100;
    __return_storage_ptr__->TileSize[2] = 1;
    if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      bVar9 = pTVar6->ComponentSize;
      uVar5 = (uint)pTVar6->BlockHeight * (uint)pTVar6->BlockWidth;
      if (bVar9 < uVar5) {
        uVar10 = 0;
        do {
          __return_storage_ptr__->TileSize[uVar10 & 1] =
               __return_storage_ptr__->TileSize[uVar10 & 1] << 1;
          uVar10 = uVar10 + 1;
        } while ((int)((uint)bVar9 << ((byte)uVar10 & 0x1f)) < (int)uVar5);
      }
    }
    else if (1 < uVar12) {
      uVar5 = 0;
      do {
        __return_storage_ptr__->TileSize[*(long *)(&DAT_00367610 + (ulong)(uVar5 & 1) * 8)] =
             __return_storage_ptr__->TileSize[*(long *)(&DAT_00367610 + (ulong)(uVar5 & 1) * 8)] >>
             1;
        uVar5 = uVar5 + 1;
      } while ((uint)(1 << ((byte)uVar5 & 0x1f)) < uVar12);
    }
    goto LAB_002fab6c;
  }
  if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    FormatString<char[26],char[54]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED",Args_1);
    Args_1_00 = (char (*) [34])0xb53;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb53);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
    uVar5 = TexDesc->SampleCount;
    if (uVar5 != 0) goto LAB_002faa36;
LAB_002faa3d:
    FormatString<char[26],char[34]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(TexDesc.SampleCount)",Args_1_00);
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb5c);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
    uVar5 = TexDesc->SampleCount;
  }
  else {
LAB_002faa36:
    Args_1_00 = (char (*) [34])(ulong)(uVar5 - 1);
    if ((uVar5 & uVar5 - 1) != 0) goto LAB_002faa3d;
  }
  UVar4 = 0x100;
  if (3 < uVar5) {
    UVar4 = (uint)(uVar5 < 0x10) * 0x40 + 0x40;
  }
  __return_storage_ptr__->TileSize[0] = 0x80 >> (7 < uVar5);
  __return_storage_ptr__->TileSize[1] = UVar4;
  __return_storage_ptr__->TileSize[2] = 1;
  if (1 < uVar12) {
    uVar5 = 0;
    do {
      __return_storage_ptr__->TileSize[*(long *)(&DAT_00367610 + (ulong)(uVar5 & 1) * 8)] =
           __return_storage_ptr__->TileSize[*(long *)(&DAT_00367610 + (ulong)(uVar5 & 1) * 8)] >> 1;
      uVar5 = uVar5 + 1;
    } while ((uint)(1 << ((byte)uVar5 & 0x1f)) < uVar12);
  }
LAB_002fab6c:
  uVar5 = __return_storage_ptr__->TileSize[0];
  local_38 = (ulong)uVar5;
  uVar10 = __return_storage_ptr__->TileSize[1];
  uVar14 = 0;
  uVar2 = __return_storage_ptr__->TileSize[2];
  uVar12 = (uVar5 / pTVar6->BlockWidth) * uVar12;
  local_40 = __return_storage_ptr__;
  if ((uVar10 / pTVar6->BlockHeight) * uVar2 * uVar12 * TexDesc->SampleCount != 0x10000) {
    FormatString<char[26],char[32]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BytesPerTile == SparseBlockSize",(char (*) [32])(ulong)uVar12);
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb88);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
    uVar5 = (uint)local_38;
  }
  if (TexDesc->MipLevels == 0) {
    UVar4 = 0xffffffff;
    uVar7 = 0;
    UVar13 = 0;
  }
  else {
    local_44 = uVar5 - 1;
    UVar4 = 0xffffffff;
    local_50 = 0;
    local_58 = 0;
    UVar13 = 0;
    MipLevel = 0;
    do {
      GetMipLevelProperties((MipLevelProperties *)local_88,TexDesc,MipLevel);
      if (((uint)local_88._12_4_ < uVar10 || (uint)local_88._8_4_ < (uint)local_38) ||
          (uint)local_88._16_4_ < uVar2) {
        if (UVar4 == 0xffffffff) {
          UVar4 = MipLevel;
          local_58 = UVar13;
        }
        local_50 = local_50 + local_60;
      }
      else {
        UVar13 = UVar13 + ((ulong)((local_88._16_4_ + uVar2) - 1) / (ulong)uVar2) *
                          ((ulong)(uint)(local_88._8_4_ + local_44) / (local_38 & 0xffffffff)) *
                          ((ulong)((local_88._12_4_ + uVar10) - 1) / (ulong)uVar10) * 0x10000;
      }
      MipLevel = MipLevel + 1;
      uVar14 = TexDesc->MipLevels;
    } while (MipLevel < uVar14);
    local_40->MipTailOffset = local_58;
    uVar7 = local_50 + 0xffffU & 0xffffffffffff0000;
  }
  if (uVar14 < UVar4) {
    UVar4 = uVar14;
  }
  local_40->FirstMipInTail = UVar4;
  local_40->MipTailSize = uVar7;
  RVar1 = TexDesc->Type;
  UVar8 = 0;
  if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    UVar8 = UVar13 + uVar7;
  }
  local_40->MipTailStride = UVar8;
  uVar11 = 1;
  if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    uVar11 = (ulong)(TexDesc->field_3).ArraySize;
  }
  local_40->AddressSpaceSize = uVar11 * (UVar13 + uVar7);
  local_40->BlockSize = 0x10000;
  local_40->Flags = SPARSE_TEXTURE_FLAG_NONE;
  return local_40;
}

Assistant:

SparseTextureProperties GetStandardSparseTextureProperties(const TextureDesc& TexDesc)
{
    constexpr Uint32            SparseBlockSize = 64 << 10;
    const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
    const Uint32                TexelSize       = FmtAttribs.GetElementSize();
    VERIFY_EXPR(IsPowerOfTwo(TexelSize));
    VERIFY_EXPR(TexelSize >= 1 && TexelSize <= 16);
    VERIFY_EXPR(TexDesc.Is2D() || TexDesc.Is3D());
    VERIFY(TexDesc.MipLevels > 0, "Number of mipmap calculation is not supported");
    VERIFY(TexDesc.SampleCount == 1 || TexDesc.MipLevels == 1, "Multisampled textures must have 1 mip level");

    SparseTextureProperties Props;

    if (TexDesc.Is3D())
    {
        DEV_CHECK_ERR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED, "Compressed sparse 3D textures are currently not supported");

        //  | Texel size  |    Tile shape   |
        //  |-------------|-----------------|
        //  |     8-Bit   |   64 x 32 x 32  |
        //  |    16-Bit   |   32 x 32 x 32  |
        //  |    32-Bit   |   32 x 32 x 16  |
        //  |    64-Bit   |   32 x 16 x 16  |
        //  |   128-Bit   |   16 x 16 x 16  |
        Props.TileSize[0] = 64;
        Props.TileSize[1] = 32;
        Props.TileSize[2] = 32;

        constexpr size_t Remap[] = {0, 2, 1};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i % 3]] /= 2;
        }
    }
    else if (TexDesc.SampleCount > 1)
    {
        VERIFY_EXPR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED);

        //  | Texel size  |   Tile shape 2x  |   Tile shape 4x  |   Tile shape 8x  |   Tile shape 16x  |
        //  |-------------|------------------|------------------|------------------|-------------------|
        //  |     8-Bit   |   128 x 256 x 1  |   128 x 128 x 1  |   64 x 128 x 1   |    64 x 64 x 1    |
        //  |    16-Bit   |   128 x 128 x 1  |   128 x  64 x 1  |   64 x  64 x 1   |    64 x 32 x 1    |
        //  |    32-Bit   |    64 x 128 x 1  |    64 x  64 x 1  |   32 x  64 x 1   |    32 x 32 x 1    |
        //  |    64-Bit   |    64 x  64 x 1  |    64 x  32 x 1  |   32 x  32 x 1   |    32 x 16 x 1    |
        //  |   128-Bit   |    32 x  64 x 1  |    32 x  32 x 1  |   16 x  32 x 1   |    16 x 16 x 1    |
        VERIFY_EXPR(IsPowerOfTwo(TexDesc.SampleCount));
        Props.TileSize[0] = 128 >> (TexDesc.SampleCount >= 8 ? 1 : 0);
        Props.TileSize[1] = 256 >> (TexDesc.SampleCount >= 4 ? (TexDesc.SampleCount >= 16 ? 2 : 1) : 0);
        Props.TileSize[2] = 1;

        constexpr size_t Remap[] = {1, 0};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i & 1]] /= 2;
        }
    }
    else
    {
        Props.TileSize[0] = 256;
        Props.TileSize[1] = 256;
        Props.TileSize[2] = 1;
        if (FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED)
        {
            //  | Texel size  |    Tile shape   |
            //  |-------------|-----------------|
            //  |     8-Bit   |  256 x 256 x 1  |
            //  |    16-Bit   |  256 x 128 x 1  |
            //  |    32-Bit   |  128 x 128 x 1  |
            //  |    64-Bit   |  128 x  64 x 1  |
            //  |   128-Bit   |   64 x  64 x 1  |
            constexpr size_t Remap[] = {1, 0};
            for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
            {
                Props.TileSize[Remap[i & 1]] /= 2;
            }
        }
        else
        {
            for (Uint32 i = 0; (FmtAttribs.ComponentSize << i) < (FmtAttribs.BlockWidth * FmtAttribs.BlockHeight); ++i)
            {
                Props.TileSize[i & 1] *= 2;
            }
        }
    }

    const Uint32 BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * TexDesc.SampleCount * TexelSize;
    VERIFY_EXPR(BytesPerTile == SparseBlockSize);

    Uint64 SliceSize     = 0;
    Props.FirstMipInTail = ~0u;
    for (Uint32 Mip = 0; Mip < TexDesc.MipLevels; ++Mip)
    {
        const MipLevelProperties MipProps  = GetMipLevelProperties(TexDesc, Mip);
        const Uint32             MipWidth  = MipProps.StorageWidth;
        const Uint32             MipHeight = MipProps.StorageHeight;
        const Uint32             MipDepth  = MipProps.Depth;

        // When the size of a texture mipmap level is at least one standard tile shape for its
        // format, the mipmap level is guaranteed to be nonpacked.
        const bool IsUnpacked =
            MipWidth >= Props.TileSize[0] &&
            MipHeight >= Props.TileSize[1] &&
            MipDepth >= Props.TileSize[2];

        if (!IsUnpacked)
        {
            // Mip tail
            if (Props.FirstMipInTail == ~0u)
            {
                Props.FirstMipInTail = Mip;
                Props.MipTailOffset  = SliceSize;
            }
            Props.MipTailSize += MipProps.MipSize;
        }
        else
        {
            const uint3 NumTilesInMip = GetNumSparseTilesInBox(Box{0, MipWidth, 0, MipHeight, 0, MipDepth}, Props.TileSize);
            SliceSize += Uint64{NumTilesInMip.x} * NumTilesInMip.y * NumTilesInMip.z * SparseBlockSize;
        }
    }

    Props.FirstMipInTail   = std::min(Props.FirstMipInTail, TexDesc.MipLevels);
    Props.MipTailSize      = AlignUp(Props.MipTailSize, SparseBlockSize);
    SliceSize              = SliceSize + Props.MipTailSize;
    Props.MipTailStride    = TexDesc.IsArray() ? SliceSize : 0;
    Props.AddressSpaceSize = SliceSize * TexDesc.GetArraySize();
    Props.BlockSize        = SparseBlockSize;
    Props.Flags            = SPARSE_TEXTURE_FLAG_NONE;

    VERIFY_EXPR(Props.MipTailSize % SparseBlockSize == 0);
    VERIFY_EXPR(Props.MipTailStride % SparseBlockSize == 0);
    VERIFY_EXPR(Props.AddressSpaceSize % SparseBlockSize == 0);

    return Props;
}